

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreCubeCheckList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t GVar1;
  uint **ppuVar2;
  byte bVar3;
  int i;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  int w;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  ppuVar2 = p->ppStas;
  iVar5 = p->nSize;
  puVar6 = (uint *)((long)(int)(((uint)pRoot & 0xfffff) * iVar5) * 4 +
                   *(long *)((long)ppuVar2 + (ulong)((uint)((ulong)pRoot >> 0x11) & 0x3ff8)));
  puVar7 = *ppuVar2;
LAB_007346b4:
  if (puVar7 == puVar6) {
    return 1;
  }
  p->nChecks = p->nChecks + 1;
  if (-1 < (int)*puVar6) {
    lVar8 = (long)p->nWords;
    if (lVar8 < 1) {
LAB_0073486a:
      memset(pSta,0,(long)(iVar5 << 2));
      iVar5 = p->nStas;
      uVar10 = iVar5 - 1;
      if ((Gia_StaAre_t *)
          ((ulong)(uVar10 & 0xfffff) * (long)p->nSize * 4 +
          *(long *)((long)p->ppStas + (ulong)(uVar10 >> 0x11 & 0x3ff8))) != pSta) {
        return 0;
      }
      p->nStas = uVar10;
      if (iVar5 != p->nStaPages * 0x100000 + -0xfffff) {
        return 0;
      }
      p->nStaPages = p->nStaPages + -1;
      return 0;
    }
    lVar9 = 0;
    do {
      uVar10 = puVar6[lVar9 + 2] ^ (uint)(&pSta[1].iPrev)[lVar9];
      if ((uVar10 >> 1 & uVar10 & 0x55555555) != 0) goto LAB_00734840;
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
    lVar9 = 0;
    while ((puVar6[lVar9 + 2] & ~(uint)(&pSta[1].iPrev)[lVar9]) == 0) {
      lVar9 = lVar9 + 1;
      if (lVar8 == lVar9) goto LAB_0073486a;
    }
    lVar9 = 0;
    do {
      if (((uint)(&pSta[1].iPrev)[lVar9] & ~puVar6[lVar9 + 2]) != 0) {
        iVar5 = -1;
        lVar9 = 0;
        goto LAB_0073475d;
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
    *puVar6 = *puVar6 | 0x80000000;
    ppuVar2 = p->ppStas;
    puVar7 = *ppuVar2;
  }
  goto LAB_00734840;
LAB_0073475d:
  do {
    uVar10 = (puVar6[lVar9 + 2] >> 1 ^ puVar6[lVar9 + 2]) &
             ~((uint)(&pSta[1].iPrev)[lVar9] >> 1 ^ (uint)(&pSta[1].iPrev)[lVar9]) & 0x55555555;
    if (uVar10 != 0) {
      if (((uVar10 & uVar10 - 1) != 0) || (-1 < iVar5)) goto LAB_00734840;
      uVar4 = 0;
      do {
        if ((uVar10 >> (uVar4 & 0x1f) & 1) != 0) goto LAB_007347b1;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x20);
      uVar4 = 0xffffffff;
LAB_007347b1:
      iVar5 = (int)lVar9 * 0x10 + (int)uVar4 / 2;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != lVar8);
  if (iVar5 != -1) {
    lVar8 = (long)(iVar5 * 2 >> 5);
    GVar1 = (&pSta[1].iPrev)[lVar8];
    uVar10 = iVar5 * 2 & 0x1e;
    bVar3 = (byte)uVar10;
    if ((((uint)GVar1 >> uVar10 & 1) != 0) || (uVar4 = 2 << bVar3, ((uint)GVar1 & uVar4) != 0)) {
      __assert_fail("!Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                    ,0x3fa,
                    "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
    }
    bVar11 = (puVar6[lVar8 + 2] >> uVar10 & 1) != 0;
    if (bVar11 == ((puVar6[lVar8 + 2] >> (bVar3 | 1) & 1) != 0)) {
      __assert_fail("Gia_StaHasValue0(pCube, iVar) ^ Gia_StaHasValue1(pCube, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                    ,0x3fb,
                    "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
    }
    if (!bVar11) {
      uVar4 = 1 << bVar3;
    }
    (&pSta[1].iPrev)[lVar8] = (Gia_PtrAre_t)((uint)GVar1 | uVar4);
  }
LAB_00734840:
  iVar5 = p->nSize;
  puVar6 = (uint *)((long)(int)((puVar6[1] & 0xfffff) * iVar5) * 4 +
                   *(long *)((long)ppuVar2 + (ulong)(puVar6[1] >> 0x11 & 0x3ff8)));
  goto LAB_007346b4;
}

Assistant:

static inline int Gia_ManAreCubeCheckList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    Gia_StaAre_t * pCube;
    int iVar;
if ( fVerbose )
{
printf( "Trying cube: " );
Gia_ManArePrintCube( p, pSta );
}
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, *pRoot), pCube )
    {
        p->nChecks++;
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
            continue;
        if ( Gia_StaAreContain( pCube, pSta, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contained in " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_ManAreRycycleSta( p, pSta );
            return 0;
        }
        if ( Gia_StaAreContain( pSta, pCube, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contains     " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_StaSetUnused( pCube );
            continue;
        }
        iVar = Gia_StaAreSharpVar( pSta, pCube, p->nWords );
        if ( iVar == -1 )
            continue;
if ( fVerbose )
{
printf( "Sharped by   " );
Gia_ManArePrintCube( p, pCube );
Gia_ManArePrintCube( p, pSta );
}
//        printf( "%d  %d\n", Gia_StaAreDashNum( pSta, pCube, p->nWords ), Gia_StaAreSharpVar( pSta, pCube, p->nWords ) );
        assert( !Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar) );
        assert(  Gia_StaHasValue0(pCube, iVar) ^  Gia_StaHasValue1(pCube, iVar) );
        if ( Gia_StaHasValue0(pCube, iVar) )
            Gia_StaSetValue1( pSta, iVar );
        else
            Gia_StaSetValue0( pSta, iVar );
//        return Gia_ManAreCubeCheckList( p, pRoot, pSta );
    }
    return 1;
}